

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O1

bool iDynTree::exportAdditionalFrame
               (string *frame_name,Transform *link_H_frame,string *link_name,
               exportAdditionalFrameDirectionOption direction_option,xmlNodePtr parent_element)

{
  pointer pcVar1;
  undefined8 uVar2;
  xmlNodePtr parent_element_00;
  string fake_joint_name;
  string parent_of_fake_joint;
  string child_of_fake_joint;
  long *local_90 [2];
  long local_80 [2];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  uVar2 = xmlNewChild(parent_element,0,"link",0);
  xmlNewProp(uVar2,"name",(frame_name->_M_dataplus)._M_p);
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"joint",0);
  local_90[0] = local_80;
  pcVar1 = (frame_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + frame_name->_M_string_length);
  std::__cxx11::string::append((char *)local_90);
  xmlNewProp(parent_element_00,"name",local_90[0]);
  xmlNewProp(parent_element_00,"type","fixed");
  exportTransform(link_H_frame,parent_element_00);
  local_68 = 0;
  local_60 = 0;
  local_48 = 0;
  local_40 = 0;
  local_70 = &local_60;
  local_50 = &local_40;
  if (direction_option == FAKE_LINK_IS_CHILD) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  std::__cxx11::string::_M_assign((string *)&local_50);
  uVar2 = xmlNewChild(parent_element_00,0,"parent",0);
  xmlNewProp(uVar2,"link",local_70);
  uVar2 = xmlNewChild(parent_element_00,0,"child",0);
  xmlNewProp(uVar2,"link",local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return true;
}

Assistant:

bool exportAdditionalFrame(const std::string frame_name, Transform link_H_frame, const std::string link_name, exportAdditionalFrameDirectionOption direction_option, xmlNodePtr parent_element)
{
    bool ok=true;

    // Export fake link
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST frame_name.c_str());

    // Export fake joint
    xmlNodePtr joint_xml = xmlNewChild(parent_element, NULL, BAD_CAST "joint", NULL);
    std::string fake_joint_name = frame_name + "_fixed_joint";
    xmlNewProp(joint_xml, BAD_CAST "name", BAD_CAST fake_joint_name.c_str());
    xmlNewProp(joint_xml, BAD_CAST "type", BAD_CAST "fixed");

    // origin
    exportTransform(link_H_frame, joint_xml);

    std::string parent_of_fake_joint, child_of_fake_joint;

    if (direction_option == FAKE_LINK_IS_CHILD) {
        parent_of_fake_joint = link_name;
        child_of_fake_joint = frame_name;
    } else {
        // direction_option == FAKE_LINK_IS_PARENT
        parent_of_fake_joint = frame_name;
        child_of_fake_joint = link_name;
    }

    // parent
    xmlNodePtr parent_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "parent", NULL);
    xmlNewProp(parent_xml, BAD_CAST "link", BAD_CAST parent_of_fake_joint.c_str());

    // child
    xmlNodePtr child_xml = xmlNewChild(joint_xml, NULL, BAD_CAST "child", NULL);
    xmlNewProp(child_xml, BAD_CAST "link", BAD_CAST child_of_fake_joint.c_str());

    return ok;
}